

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorDatabase::FindAllMessageNames
          (DescriptorDatabase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *output)

{
  int iVar1;
  LogMessage *pLVar2;
  long lVar3;
  string *value;
  long lVar4;
  SourceCodeInfo **this_00;
  long lVar5;
  bool bVar6;
  undefined1 local_1b8 [8];
  FileDescriptorProto file_proto;
  undefined1 local_a8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  set;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_names;
  LogFinisher local_31;
  
  set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar1 = (*this->_vptr_DescriptorDatabase[6])();
  if ((char)iVar1 == '\0') {
    bVar6 = false;
  }
  else {
    set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&set;
    set._M_t._M_impl._0_4_ = 0;
    set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    set._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_1b8,(Arena *)0x0);
    bVar6 = set._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
    if (!bVar6) {
      bVar6 = false;
      value = (string *)set._M_t._M_impl.super__Rb_tree_header._M_node_count;
      do {
        this_00 = &file_proto.source_code_info_;
        FileDescriptorProto::Clear((FileDescriptorProto *)local_1b8);
        iVar1 = (*this->_vptr_DescriptorDatabase[2])(this,value,(FileDescriptorProto *)local_1b8);
        if ((char)iVar1 == '\0') {
          internal::LogMessage::LogMessage
                    ((LogMessage *)this_00,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/descriptor_database.cc"
                     ,0x51);
          pLVar2 = internal::LogMessage::operator<<
                             ((LogMessage *)this_00,"File not found in database (unexpected): ");
          pLVar2 = internal::LogMessage::operator<<(pLVar2,value);
          internal::LogFinisher::operator=(&local_31,pLVar2);
          internal::LogMessage::~LogMessage((LogMessage *)this_00);
        }
        else {
          lVar4 = file_proto.message_type_.super_RepeatedPtrFieldBase._8_8_ + 8;
          if (file_proto.message_type_.super_RepeatedPtrFieldBase._8_8_ == 0) {
            lVar4 = 0;
          }
          lVar5 = (long)(int)file_proto.message_type_.super_RepeatedPtrFieldBase.arena_;
          if (lVar5 != 0) {
            lVar3 = 0;
            do {
              anon_unknown_32::RecordMessageNames
                        (*(DescriptorProto **)(lVar4 + lVar3),file_proto.name_.ptr_,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_a8);
              lVar3 = lVar3 + 8;
            } while (lVar5 * 8 != lVar3);
          }
        }
        if ((char)iVar1 == '\0') goto LAB_002b38f1;
        value = value + 1;
        bVar6 = value == (string *)0x0;
      } while (!bVar6);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)output,
               (output->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,&set);
LAB_002b38f1:
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1b8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return bVar6;
}

Assistant:

bool DescriptorDatabase::FindAllMessageNames(std::vector<std::string>* output) {
  return ForAllFileProtos(
      this,
      [](const FileDescriptorProto& file_proto, std::set<std::string>* set) {
        RecordMessageNames(file_proto, set);
      },
      output);
}